

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

void OnDiskIndex::on_disk_merge_core
               (vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,RawFile *out,
               TaskSpec *task)

{
  OnDiskIndex *pOVar1;
  uchar *puVar2;
  bool bVar3;
  runtime_error *this;
  void *__buf;
  reference pvVar4;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *pvVar5;
  uint64_t uVar6;
  long in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  undefined8 in_RDI;
  __off_t in_R8;
  OnDiskRun OVar7;
  OnDiskRun OVar8;
  uint8_t *run_end;
  uint8_t *run_start;
  uint8_t *run_base;
  IndexMergeHelper *ndx_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *__range3;
  FileId base_files;
  uint64_t base_bytes;
  int i;
  OnDiskRun run;
  IndexMergeHelper *ndx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *__range2;
  uint8_t *batch_ptr;
  uint64_t batch_size;
  TriGram trigram;
  PosixRunWriter writer;
  uint8_t *batch_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> batch_vector;
  uint64_t MAX_BATCH_BYTES;
  uint64_t out_offset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  TaskSpec *in_stack_fffffffffffffda0;
  PosixRunWriter *pPVar9;
  undefined8 in_stack_fffffffffffffda8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  IndexMergeHelper *in_stack_fffffffffffffdb0;
  uint8_t *in_stack_fffffffffffffdb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdc0;
  uint64_t in_stack_fffffffffffffdc8;
  FileId base;
  uint64_t in_stack_fffffffffffffdd0;
  uint64_t in_stack_fffffffffffffdd8;
  RawFile *in_stack_fffffffffffffde0;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *in_stack_fffffffffffffde8;
  OnDiskRun local_178;
  OnDiskRun local_168;
  uchar *local_158;
  OnDiskRun local_150;
  uchar *local_140;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *local_138;
  reference local_130;
  IndexMergeHelper *local_128;
  __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
  local_120;
  undefined8 local_118;
  int local_10c;
  long local_108;
  int local_fc;
  OnDiskRun local_f8;
  reference local_e8;
  IndexMergeHelper *local_e0;
  __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
  local_d8;
  undefined8 local_d0;
  uchar *local_c8;
  uint64_t local_c0;
  uint local_b4;
  PosixRunWriter local_b0;
  uchar *local_80;
  undefined8 local_58;
  PosixRunWriter *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  long local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x19efe4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdc0,
             (size_type)in_stack_fffffffffffffdb8,(allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x19f00d);
  local_50 = (PosixRunWriter *)0x10;
  local_58 = 0x40000000;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x19f03a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8,
             (allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x19f063);
  local_80 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19f070);
  RawFile::get((RawFile *)local_10);
  PosixRunWriter::PosixRunWriter
            ((PosixRunWriter *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
  OVar8.end_ = in_stack_fffffffffffffdd0;
  OVar8.start_ = in_stack_fffffffffffffdd8;
  local_b4 = 0;
  while( true ) {
    if (0xffffff < local_b4) {
      PosixRunWriter::flush((PosixRunWriter *)OVar8.end_);
      this_00 = &local_30;
      pPVar9 = local_50;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (this_00,0x1000000);
      *pvVar4 = (value_type)pPVar9;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x19f71a);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
      RawFile::write<unsigned_long>
                (in_stack_fffffffffffffde0,(unsigned_long *)OVar8.start_,OVar8.end_);
      PosixRunWriter::~PosixRunWriter(pPVar9);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_10);
      return;
    }
    local_c0 = find_max_batch(in_stack_fffffffffffffde8,
                              (uint32_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),OVar8.start_);
    if (local_c0 == 0) break;
    local_c8 = local_80;
    local_d0 = local_8;
    local_d8._M_current =
         (IndexMergeHelper *)
         std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::begin
                   ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                    CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    local_e0 = (IndexMergeHelper *)
               std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::end
                         ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                          CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                          *)in_stack_fffffffffffffda0,
                         (__normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                          *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      if (!bVar3) break;
      local_e8 = __gnu_cxx::
                 __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                 ::operator*(&local_d8);
      OVar7 = IndexMergeHelper::run
                        (in_stack_fffffffffffffdb0,
                         (uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                         (size_t)in_stack_fffffffffffffda0);
      puVar2 = local_c8;
      pOVar1 = local_e8->index;
      local_f8 = OVar7;
      __buf = (void *)OnDiskRun::size(&local_f8);
      uVar6 = OnDiskRun::start(&local_f8);
      RawFile::pread(&pOVar1->ndxfile,(int)puVar2,__buf,uVar6,in_R8);
      uVar6 = OnDiskRun::size(&local_f8);
      local_c8 = local_c8 + uVar6;
      __gnu_cxx::
      __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
      ::operator++(&local_d8);
    }
    for (local_fc = 0; pPVar9 = local_50, local_fc < (int)local_c0; local_fc = local_fc + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,(ulong)(local_b4 + local_fc));
      *pvVar4 = (value_type)pPVar9;
      local_108 = 0;
      local_10c = 0;
      local_118 = local_8;
      local_120._M_current =
           (IndexMergeHelper *)
           std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::begin
                     ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                      CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      local_128 = (IndexMergeHelper *)
                  std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::end
                            ((vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                            *)in_stack_fffffffffffffda0,
                           (__normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                            *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        base = (FileId)(in_stack_fffffffffffffdc8 >> 0x20);
        if (!bVar3) break;
        local_130 = __gnu_cxx::
                    __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                    ::operator*(&local_120);
        pvVar5 = (vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
                 (local_80 + local_108);
        local_138 = pvVar5;
        OVar7 = IndexMergeHelper::run
                          (in_stack_fffffffffffffdb0,
                           (uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                           (size_t)in_stack_fffffffffffffda0);
        local_150 = OVar7;
        uVar6 = OnDiskRun::size(&local_150);
        local_140 = (uchar *)((long)&(pvVar5->
                                     super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar6);
        in_stack_fffffffffffffde8 = local_138;
        OVar7 = IndexMergeHelper::run
                          (in_stack_fffffffffffffdb0,
                           (uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                           (size_t)in_stack_fffffffffffffda0);
        local_168 = OVar7;
        in_stack_fffffffffffffde0 = (RawFile *)OnDiskRun::size(&local_168);
        local_158 = (uchar *)((long)&in_stack_fffffffffffffde0->fd +
                             (long)&in_stack_fffffffffffffde8->
                                    super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>
                             );
        PosixRunWriter::write_raw
                  ((PosixRunWriter *)OVar8.end_,base,(uint8_t *)in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8);
        OVar8 = IndexMergeHelper::run
                          (in_stack_fffffffffffffdb0,
                           (uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                           (size_t)in_stack_fffffffffffffda0);
        local_178 = OVar8;
        in_stack_fffffffffffffdc8 = OnDiskRun::size(&local_178);
        local_108 = in_stack_fffffffffffffdc8 + local_108;
        local_10c = local_130->file_count + local_10c;
        __gnu_cxx::
        __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
        ::operator++(&local_120);
      }
      in_stack_fffffffffffffdc0 =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           PosixRunWriter::bytes_written(&local_b0);
      local_50 = (PosixRunWriter *)
                 ((long)&(in_stack_fffffffffffffdc0->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + (long)&local_50->fd_);
      PosixRunWriter::reset(&local_b0);
    }
    if (local_18 != 0) {
      TaskSpec::add_progress
                (in_stack_fffffffffffffda0,
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
    local_b4 = local_b4 + (int)local_c0;
  }
  spdlog::error<char[46]>((char (*) [46])0x19f10e);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Can\'t merge, batch size too big");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OnDiskIndex::on_disk_merge_core(
    const std::vector<IndexMergeHelper> &indexes, RawFile *out,
    TaskSpec *task) {
    // Offsets to every run in the file (including the header).
    std::vector<uint64_t> offsets(NUM_TRIGRAMS + 1);

    // Current offset in the file (equal to size of the header intially).
    uint64_t out_offset = 16;

    // Arbitrary number describing how much RAM we want to spend on the run
    // cache during the batched stream pass.
    constexpr uint64_t MAX_BATCH_BYTES = 1024ULL * 1024ULL * 1024ULL;

    // Vector used for all merge passes (to avoid unnecessary reallocations).
    std::vector<uint8_t> batch_vector(MAX_BATCH_BYTES);
    uint8_t *batch_data = batch_vector.data();

    PosixRunWriter writer(out->get());

    // Main merge loop.
    TriGram trigram = 0;
    while (trigram < NUM_TRIGRAMS) {
        uint64_t batch_size = find_max_batch(indexes, trigram, MAX_BATCH_BYTES);

        if (batch_size == 0) {
            // TODO(unknown): fallback to old unbatched merge method.
            spdlog::error("Merge too big, can't fit into MAX_BATCH_BYTES");
            throw std::runtime_error("Can't merge, batch size too big");
        }

        // Read batch_size runs at once.
        uint8_t *batch_ptr = batch_data;
        for (const auto &ndx : indexes) {
            OnDiskRun run = ndx.run(trigram, batch_size);
            ndx.index->ndxfile.pread(batch_ptr, run.size(), run.start());
            batch_ptr += run.size();
        }

        // Write the runs to the output file in a proper order.
        for (int i = 0; i < static_cast<int>(batch_size); i++) {
            offsets[trigram + i] = out_offset;
            uint64_t base_bytes = 0;
            FileId base_files = 0;
            for (const auto &ndx : indexes) {
                uint8_t *run_base = batch_data + base_bytes;
                uint8_t *run_start = run_base + ndx.run(trigram, i).size();
                uint8_t *run_end = run_base + ndx.run(trigram, i + 1).size();
                writer.write_raw(base_files, run_start, run_end);
                base_bytes += ndx.run(trigram, batch_size).size();
                base_files += ndx.file_count;
            }
            out_offset += writer.bytes_written();
            writer.reset();
        }

        // Bookkeeping - update progress and current trigram ndx.
        if (task != nullptr) {
            task->add_progress(batch_size);
        }
        trigram += batch_size;
    }
    writer.flush();

    // Write the footer - 128MB header with run offsets.
    offsets[NUM_TRIGRAMS] = out_offset;
    out->write<uint64_t>(offsets.data(), offsets.size());
}